

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLSLUtils.cpp
# Opt level: O1

String * __thiscall
Diligent::BuildGLSLSourceString_abi_cxx11_
          (String *__return_storage_ptr__,Diligent *this,BuildGLSLSourceStringAttribs *Attribs)

{
  ShaderCreateInfo *ShaderCI;
  long lVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  ostream *poVar5;
  HLSL2GLSLConverterImpl *this_00;
  char *pcVar6;
  bool IsES;
  ShaderVersion GLSLVer;
  ShaderSourceFileData SourceData;
  String ConvertedSource;
  string msg;
  bool local_20d;
  SHADER_TYPE local_20c;
  ShaderVersion local_208;
  ShaderSourceFileData local_200;
  String local_1e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1c8;
  long local_1c0;
  undefined1 local_1b8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8;
  undefined5 local_198;
  undefined3 uStack_193;
  SHADER_TYPE local_190;
  bool local_18c;
  Char *local_188;
  Char *local_180;
  ushort local_178;
  ios_base local_138 [264];
  
  ShaderCI = *(ShaderCreateInfo **)this;
  if (ShaderCI->SourceLanguage < SHADER_SOURCE_LANGUAGE_MSL) {
    ReadShaderSourceFile
              (&local_200,ShaderCI->Source,(ShaderCI->field_4).SourceLength,
               ShaderCI->pShaderSourceStreamFactory,ShaderCI->FilePath);
    if (ShaderCI->SourceLanguage == SHADER_SOURCE_LANGUAGE_GLSL_VERBATIM) {
      if (((ShaderCI->Macros).Elements != (ShaderMacro *)0x0) && ((ShaderCI->Macros).Count != 0)) {
        FormatString<char[55]>
                  ((string *)local_1b8,
                   (char (*) [55])"Shader macros are ignored when compiling GLSL verbatim");
        if (DebugMessageCallback != (undefined *)0x0) {
          (*(code *)DebugMessageCallback)(1,local_1b8._0_8_,0,0,0);
        }
        if ((IShaderSourceInputStreamFactory *)local_1b8._0_8_ !=
            (IShaderSourceInputStreamFactory *)(local_1b8 + 0x10)) {
          operator_delete((void *)local_1b8._0_8_,(ulong)(local_1a8._M_allocated_capacity + 1));
        }
      }
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)__return_storage_ptr__,local_200.Source,
                 local_200.Source + local_200.SourceLength);
    }
    else {
      local_208.Major = 0;
      local_208.Minor = 0;
      local_20d = false;
      GetGLSLVersion(ShaderCI,*(TargetGLSLCompiler *)(this + 0x3c),
                     *(RENDER_DEVICE_TYPE *)(this + 0x18),
                     (RenderDeviceShaderVersionInfo *)(this + 0x1c),&local_208,&local_20d);
      local_20c = (ShaderCI->Desc).ShaderType;
      local_1c8 = &__return_storage_ptr__->field_2;
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_1c8;
      __return_storage_ptr__->_M_string_length = 0;
      (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
      std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_1b8 + 0x10),"#version ",9);
      poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)(local_1b8 + 0x10));
      poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
      bVar4 = local_20d;
      pcVar6 = "0 core\n";
      if (local_20d != false) {
        pcVar6 = "0 es\n";
      }
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5,pcVar6,(ulong)(local_20d ^ 1) * 2 + 5);
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_1e8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
        operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
      std::ios_base::~ios_base(local_138);
      if (bVar4 != false) {
        lVar1 = *(long *)(this + 8);
        bVar2 = local_208.Minor != 0;
        bVar3 = 1 < local_208.Minor;
        if (local_208.Major != 3) {
          bVar2 = 2 < local_208.Major;
          bVar3 = 2 < local_208.Major;
        }
        if (!(bool)(**(char **)(this + 0x10) == '\0' | bVar2)) {
          std::__cxx11::string::append((char *)__return_storage_ptr__);
        }
        if (*(char *)(lVar1 + 0x127) == '\x01' && !bVar3) {
          std::__cxx11::string::append((char *)__return_storage_ptr__);
        }
        if (local_20c == SHADER_TYPE_GEOMETRY && !bVar3) {
          std::__cxx11::string::append((char *)__return_storage_ptr__);
        }
        if (((local_20c == SHADER_TYPE_DOMAIN) || (local_20c == SHADER_TYPE_HULL)) && (!bVar3)) {
          std::__cxx11::string::append((char *)__return_storage_ptr__);
        }
      }
      if ((ShaderCI->GLSLExtensions != (char *)0x0) && (*ShaderCI->GLSLExtensions != '\0')) {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
        std::__cxx11::string::push_back((char)__return_storage_ptr__);
      }
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      if (this[0x40] == (Diligent)0x1) {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      if (*(long *)(this + 0x48) != 0) {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      AppendPlatformDefinition(__return_storage_ptr__);
      AppendShaderTypeDefinitions(__return_storage_ptr__,local_20c);
      if (bVar4 != false) {
        lVar1 = *(long *)(this + 8);
        local_1c0 = *(long *)(this + 0x10);
        bVar2 = 2 < local_208.Major;
        if (local_208.Major == 3) {
          bVar2 = 1 < local_208.Minor;
        }
        std::__cxx11::string::append((char *)__return_storage_ptr__);
        if (bVar2) {
          std::__cxx11::string::append((char *)__return_storage_ptr__);
        }
        if (*(char *)(lVar1 + 0x127) == '\x01') {
          std::__cxx11::string::append((char *)__return_storage_ptr__);
        }
        if (*(char *)(lVar1 + 0x124) == '\x01') {
          std::__cxx11::string::append((char *)__return_storage_ptr__);
        }
        if ((*(char *)(local_1c0 + 4) != '\0') &&
           (std::__cxx11::string::append((char *)__return_storage_ptr__), bVar2)) {
          std::__cxx11::string::append((char *)__return_storage_ptr__);
        }
      }
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      AppendShaderMacros(__return_storage_ptr__,&ShaderCI->Macros);
      if ((((bVar4 != false) && (local_208.Major == 3)) && (local_208.Minor == 0)) &&
         (local_20c == SHADER_TYPE_VERTEX && **(char **)(this + 0x10) != '\0')) {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      if (ShaderCI->SourceLanguage == SHADER_SOURCE_LANGUAGE_HLSL) {
        if (((ShaderCI->Desc).UseCombinedTextureSamplers == false) &&
           ((ShaderCI->CompileFlags & SHADER_COMPILE_FLAG_HLSL_TO_SPIRV_VIA_GLSL) ==
            SHADER_COMPILE_FLAG_NONE)) {
          LogError<true,char[70]>
                    (false,"BuildGLSLSourceString",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/ShaderTools/src/GLSLUtils.cpp"
                     ,0x171,(char (*) [70])
                            "Combined texture samplers are required to convert HLSL source to GLSL")
          ;
        }
        this_00 = HLSL2GLSLConverterImpl::GetInstance();
        local_1b8._0_8_ = ShaderCI->pShaderSourceStreamFactory;
        local_1b8._8_8_ = *(undefined8 *)(this + 0x50);
        local_1a8._M_allocated_capacity = (size_type)local_200.Source;
        local_1a8._M_local_buf[0xc] = 0;
        local_1a8._8_4_ = local_200.SourceLength;
        local_1a8._13_3_ = 0;
        local_198 = SUB85(ShaderCI->EntryPoint,0);
        uStack_193 = (undefined3)((ulong)ShaderCI->EntryPoint >> 0x28);
        local_190 = (ShaderCI->Desc).ShaderType;
        local_18c = true;
        local_188 = ShaderCI->FilePath;
        local_180 = (ShaderCI->Desc).CombinedSamplerSuffix;
        if (local_180 == (Char *)0x0) {
          local_180 = "_sampler";
        }
        local_178 = CONCAT11((byte)(char)ShaderCI->CompileFlags >> 3,
                             **(char **)(this + 0x10) != '\0') & 0x1ff;
        HLSL2GLSLConverterImpl::Convert_abi_cxx11_
                  (&local_1e8,this_00,(ConversionAttribs *)local_1b8);
        if (local_1e8._M_string_length == 0) {
          LogError<true,char[38]>
                    (false,"BuildGLSLSourceString",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/ShaderTools/src/GLSLUtils.cpp"
                     ,0x18b,(char (*) [38])"Failed to convert HLSL source to GLSL");
        }
        std::__cxx11::string::_M_append
                  ((char *)__return_storage_ptr__,(ulong)local_1e8._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
          operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
        }
      }
      else {
        std::__cxx11::string::append((char *)__return_storage_ptr__,(ulong)local_200.Source);
      }
    }
    if (local_200.pFileData.m_pObject != (IDataBlob *)0x0) {
      (*((local_200.pFileData.m_pObject)->super_IObject)._vptr_IObject[2])();
    }
  }
  else {
    FormatString<char[35]>((string *)local_1b8,(char (*) [35])"Unsupported shader source language");
    DebugAssertionFailed
              ((Char *)local_1b8._0_8_,"BuildGLSLSourceString",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/ShaderTools/src/GLSLUtils.cpp"
               ,0x100);
    if ((IShaderSourceInputStreamFactory *)local_1b8._0_8_ !=
        (IShaderSourceInputStreamFactory *)(local_1b8 + 0x10)) {
      operator_delete((void *)local_1b8._0_8_,(ulong)(local_1a8._M_allocated_capacity + 1));
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  }
  return __return_storage_ptr__;
}

Assistant:

String BuildGLSLSourceString(const BuildGLSLSourceStringAttribs& Attribs) noexcept(false)
{
    const ShaderCreateInfo& ShaderCI = Attribs.ShaderCI;

    if (!(ShaderCI.SourceLanguage == SHADER_SOURCE_LANGUAGE_DEFAULT ||
          ShaderCI.SourceLanguage == SHADER_SOURCE_LANGUAGE_GLSL ||
          ShaderCI.SourceLanguage == SHADER_SOURCE_LANGUAGE_GLSL_VERBATIM ||
          ShaderCI.SourceLanguage == SHADER_SOURCE_LANGUAGE_HLSL))
    {
        UNSUPPORTED("Unsupported shader source language");
        return "";
    }

    const ShaderSourceFileData SourceData = ReadShaderSourceFile(ShaderCI);
    if (ShaderCI.SourceLanguage == SHADER_SOURCE_LANGUAGE_GLSL_VERBATIM)
    {
        if (ShaderCI.Macros)
        {
            LOG_WARNING_MESSAGE("Shader macros are ignored when compiling GLSL verbatim");
        }

        return std::string{SourceData.Source, SourceData.SourceLength};
    }

    ShaderVersion GLSLVer;
    bool          IsES = false;
    GetGLSLVersion(ShaderCI, Attribs.TargetCompiler, Attribs.DeviceType, Attribs.MaxShaderVersion, GLSLVer, IsES);

    const SHADER_TYPE ShaderType = ShaderCI.Desc.ShaderType;

    String GLSLSource;
    {
        std::stringstream verss;
        verss << "#version " << Uint32{GLSLVer.Major} << Uint32{GLSLVer.Minor} << (IsES ? "0 es\n" : "0 core\n");
        GLSLSource = verss.str();
    }

    // All extensions must go right after the version directive
    if (IsES)
    {
        AppendGLESExtensions(ShaderType, Attribs.Features, Attribs.AdapterInfo.Texture, GLSLVer, GLSLSource);
    }

    if (ShaderCI.GLSLExtensions != nullptr && ShaderCI.GLSLExtensions[0] != '\0')
    {
        GLSLSource.append(ShaderCI.GLSLExtensions);
        GLSLSource.push_back('\n');
    }

    if (IsES)
    {
        GLSLSource.append("#ifndef GL_ES\n"
                          "#  define GL_ES 1\n"
                          "#endif\n");
    }
    else
    {
        GLSLSource.append("#define DESKTOP_GL 1\n");
    }

    if (Attribs.ZeroToOneClipZ)
    {
        GLSLSource.append("#define _NDC_ZERO_TO_ONE 1\n");
    }

    if (Attribs.ExtraDefinitions != nullptr)
    {
        GLSLSource.append(Attribs.ExtraDefinitions);
    }

    AppendPlatformDefinition(GLSLSource);
    AppendShaderTypeDefinitions(GLSLSource, ShaderType);

    if (IsES)
    {
        AppendPrecisionQualifiers(Attribs.Features, Attribs.AdapterInfo.Texture, GLSLVer, GLSLSource);
    }

    // It would be much more convenient to use row_major matrices.
    // But unfortunately on NVIDIA, the following directive
    // layout(std140, row_major) uniform;
    // does not have any effect on matrices that are part of structures
    // So we have to use column-major matrices which are default in both
    // DX and GLSL.
    GLSLSource.append("layout(std140) uniform;\n");

    AppendShaderMacros(GLSLSource, ShaderCI.Macros);

    if (IsES && GLSLVer == ShaderVersion{3, 0} && Attribs.Features.SeparablePrograms && ShaderType == SHADER_TYPE_VERTEX)
    {
        // From https://www.khronos.org/registry/OpenGL/extensions/EXT/EXT_separate_shader_objects.gles.txt:
        //
        // When using GLSL ES 3.00 shaders in separable programs, gl_Position and
        // gl_PointSize built-in outputs must be redeclared according to Section 7.5
        // of the OpenGL Shading Language Specification...
        //
        // add to GLSL ES 3.00 new section 7.5, Built-In Redeclaration and
        // Separable Programs:
        //
        // "The following vertex shader outputs may be redeclared at global scope to
        // specify a built-in output interface, with or without special qualifiers:
        //
        //     gl_Position
        //     gl_PointSize
        //
        //   When compiling shaders using either of the above variables, both such
        //   variables must be redeclared prior to use.  ((Note:  This restriction
        //   applies only to shaders using version 300 that enable the
        //   EXT_separate_shader_objects extension; shaders not enabling the
        //   extension do not have this requirement.))  A separable program object
        //   will fail to link if any attached shader uses one of the above variables
        //   without redeclaration."
        GLSLSource.append("out vec4 gl_Position;\n");
    }

    if (ShaderCI.SourceLanguage == SHADER_SOURCE_LANGUAGE_HLSL)
    {
#if DILIGENT_NO_HLSL
        LOG_ERROR_AND_THROW("Unable to convert HLSL source to GLSL: HLSL support is disabled");
#else
        if (!ShaderCI.Desc.UseCombinedTextureSamplers && (ShaderCI.CompileFlags & SHADER_COMPILE_FLAG_HLSL_TO_SPIRV_VIA_GLSL) == 0)
        {
            LOG_ERROR_AND_THROW("Combined texture samplers are required to convert HLSL source to GLSL");
        }
        // Convert HLSL to GLSL
        const HLSL2GLSLConverterImpl& Converter = HLSL2GLSLConverterImpl::GetInstance();

        HLSL2GLSLConverterImpl::ConversionAttribs ConvertAttribs;
        ConvertAttribs.pSourceStreamFactory = ShaderCI.pShaderSourceStreamFactory;
        ConvertAttribs.ppConversionStream   = Attribs.ppConversionStream;
        ConvertAttribs.HLSLSource           = SourceData.Source;
        ConvertAttribs.NumSymbols           = SourceData.SourceLength;
        ConvertAttribs.EntryPoint           = ShaderCI.EntryPoint;
        ConvertAttribs.ShaderType           = ShaderCI.Desc.ShaderType;
        ConvertAttribs.IncludeDefinitions   = true;
        ConvertAttribs.InputFileName        = ShaderCI.FilePath;
        ConvertAttribs.SamplerSuffix        = ShaderCI.Desc.CombinedSamplerSuffix != nullptr ?
            ShaderCI.Desc.CombinedSamplerSuffix :
            ShaderDesc{}.CombinedSamplerSuffix;
        // Separate shader objects extension also allows input/output layout qualifiers for
        // all shader stages.
        // https://www.khronos.org/registry/OpenGL/extensions/ARB/ARB_separate_shader_objects.txt
        // (search for "Input Layout Qualifiers" and "Output Layout Qualifiers").
        ConvertAttribs.UseInOutLocationQualifiers = Attribs.Features.SeparablePrograms;
        ConvertAttribs.UseRowMajorMatrices        = (ShaderCI.CompileFlags & SHADER_COMPILE_FLAG_PACK_MATRIX_ROW_MAJOR) != 0;
        String ConvertedSource                    = Converter.Convert(ConvertAttribs);
        if (ConvertedSource.empty())
        {
            LOG_ERROR_AND_THROW("Failed to convert HLSL source to GLSL");
        }
        GLSLSource.append(ConvertedSource);
#endif
    }
    else
    {
        GLSLSource.append(SourceData.Source, SourceData.SourceLength);
    }

    return GLSLSource;
}